

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlRpcValue.cpp
# Opt level: O0

ssize_t __thiscall XmlRpc::XmlRpcValue::write(XmlRpcValue *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  char *pcVar2;
  size_type sVar3;
  reference this_00;
  pointer ppVar4;
  ostream *poVar5;
  istream *istream_in;
  uint *__n_00;
  void *__buf_00;
  void *__buf_01;
  undefined4 in_register_00000034;
  const_iterator it;
  int i;
  int s;
  Encoder encoder;
  stringstream buffer;
  char buf [20];
  tm *t;
  undefined4 in_stack_fffffffffffffd98;
  int in_stack_fffffffffffffd9c;
  undefined4 in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda4;
  iterator in_stack_fffffffffffffde0;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue>_>
  local_218;
  iterator local_210;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue>_>
  local_208;
  iterator local_200;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue>_>
  local_1f8;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue>_>
  local_1f0;
  int local_1e4;
  int local_1e0;
  stringstream local_1c0 [16];
  char local_1b0 [376];
  char local_38 [19];
  undefined1 local_25;
  tm *local_18;
  ostream *local_10;
  XmlRpcValue *local_8;
  
  local_10 = (ostream *)CONCAT44(in_register_00000034,__fd);
  istream_in = (istream *)(ulong)(this->_type - TypeBoolean);
  __n_00 = &switchD_0056e4c7::switchdataD_00585d6c;
  local_8 = this;
  switch(istream_in) {
  case (istream *)0x0:
    std::ostream::operator<<(local_10,(bool)((this->_value).asBool & 1));
    break;
  case (istream *)0x1:
    std::ostream::operator<<(local_10,(this->_value).asInt);
    break;
  case (istream *)0x2:
    std::ostream::operator<<(local_10,(this->_value).asDouble);
    break;
  case (istream *)0x3:
    std::operator<<(local_10,(string *)(this->_value).asTime);
    break;
  case (istream *)0x4:
    local_18 = (this->_value).asTime;
    snprintf(local_38,0x13,"%4d%02d%02dT%02d:%02d:%02d",(ulong)(uint)local_18->tm_year,
             (ulong)(uint)local_18->tm_mon,(ulong)(uint)local_18->tm_mday,local_18->tm_hour,
             local_18->tm_min,local_18->tm_sec);
    local_25 = 0;
    std::operator<<(local_10,local_38);
    break;
  case (istream *)0x5:
    std::__cxx11::stringstream::stringstream(local_1c0);
    pcVar2 = std::vector<char,_std::allocator<char>_>::data
                       ((vector<char,_std::allocator<char>_> *)0x56e606);
    std::vector<char,_std::allocator<char>_>::size
              ((vector<char,_std::allocator<char>_> *)(this->_value).asTime);
    std::ostream::write(local_1b0,(long)pcVar2);
    base64::Encoder::Encoder
              ((Encoder *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
               in_stack_fffffffffffffd9c);
    base64::Encoder::encode((Encoder *)in_stack_fffffffffffffde0._M_node,istream_in,(ostream *)this)
    ;
    std::__cxx11::stringstream::~stringstream(local_1c0);
    break;
  case (istream *)0x6:
    sVar3 = std::vector<XmlRpc::XmlRpcValue,_std::allocator<XmlRpc::XmlRpcValue>_>::size
                      ((vector<XmlRpc::XmlRpcValue,_std::allocator<XmlRpc::XmlRpcValue>_> *)
                       (this->_value).asTime);
    local_1e0 = (int)sVar3;
    std::operator<<(local_10,'{');
    for (local_1e4 = 0; local_1e4 < local_1e0; local_1e4 = local_1e4 + 1) {
      if (0 < local_1e4) {
        std::operator<<(local_10,',');
      }
      this_00 = std::vector<XmlRpc::XmlRpcValue,_std::allocator<XmlRpc::XmlRpcValue>_>::at
                          ((vector<XmlRpc::XmlRpcValue,_std::allocator<XmlRpc::XmlRpcValue>_> *)
                           CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                           CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
      write(this_00,(int)local_10,__buf_00,(size_t)__n_00);
    }
    std::operator<<(local_10,'}');
    break;
  case (istream *)0x7:
    std::operator<<(local_10,'[');
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue>_>
    ::_Rb_tree_const_iterator(&local_1f0);
    local_200._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue>_>_>
         ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue>_>_>
                  *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue>_>
    ::_Rb_tree_const_iterator(&local_1f8,&local_200);
    local_1f0._M_node = local_1f8._M_node;
    while( true ) {
      local_210._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue>_>_>
                  *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue>_>
      ::_Rb_tree_const_iterator(&local_208,&local_210);
      bVar1 = std::operator!=(&local_1f0,&local_208);
      if (!bVar1) break;
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue>_>_>
      ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue>_>_>
               *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue>_>
      ::_Rb_tree_const_iterator(&local_218,(iterator *)&stack0xfffffffffffffde0);
      bVar1 = std::operator!=(&local_1f0,&local_218);
      if (bVar1) {
        std::operator<<(local_10,',');
      }
      poVar5 = local_10;
      ppVar4 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue>_>
               ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue>_>
                             *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
      poVar5 = std::operator<<(poVar5,(string *)ppVar4);
      std::operator<<(poVar5,':');
      ppVar4 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue>_>
               ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue>_>
                             *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
      write(&ppVar4->second,(int)local_10,__buf_01,(size_t)__n_00);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue>_>
      ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue>_>
                    *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
    }
    std::operator<<(local_10,']');
  }
  return (ssize_t)local_10;
}

Assistant:

std::ostream& XmlRpcValue::write(std::ostream& os) const {
    switch (_type) {
      default:           break;
      case TypeBoolean:  os << _value.asBool; break;
      case TypeInt:      os << _value.asInt; break;
      case TypeDouble:   os << _value.asDouble; break;
      case TypeString:   os << *_value.asString; break;
      case TypeDateTime:
        {
          struct tm* t = _value.asTime;
          char buf[20];
          std::snprintf(buf, sizeof(buf)-1, "%4d%02d%02dT%02d:%02d:%02d", 
            t->tm_year,t->tm_mon,t->tm_mday,t->tm_hour,t->tm_min,t->tm_sec);
          buf[sizeof(buf)-1] = 0;
          os << buf;
          break;
        }
      case TypeBase64:
        {
          std::stringstream buffer;
          buffer.write(_value.asBinary->data(), _value.asBinary->size());
          base64::Encoder encoder;
          encoder.encode(buffer, os);
          break;
        }
      case TypeArray:
        {
          int s = int(_value.asArray->size());
          os << '{';
          for (int i=0; i<s; ++i)
          {
            if (i > 0) os << ',';
            _value.asArray->at(i).write(os);
          }
          os << '}';
          break;
        }
      case TypeStruct:
        {
          os << '[';
          ValueStruct::const_iterator it;
          for (it=_value.asStruct->begin(); it!=_value.asStruct->end(); ++it)
          {
            if (it!=_value.asStruct->begin()) os << ',';
            os << it->first << ':';
            it->second.write(os);
          }
          os << ']';
          break;
        }
    }
    
    return os;
  }